

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<double,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  long *plVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  unsigned_long *puVar7;
  long *plVar8;
  long lVar9;
  size_t sVar10;
  unsigned_long *puVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar15;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_70;
  double local_68;
  
  lVar9 = Xc_indptr[col_num];
  lVar3 = Xc_indptr[col_num + 1];
  if (lVar9 != lVar3) {
    puVar7 = ix_arr + st;
    local_a8 = 0.0;
    for (sVar10 = st; sVar10 <= end; sVar10 = sVar10 + 1) {
      pVar15 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::try_emplace<unsigned_long_const&>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,puVar7);
      local_a8 = local_a8 + *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
      puVar7 = puVar7 + 1;
    }
    if (0.0 < local_a8) {
      plVar1 = Xc_ind + lVar3;
      uVar4 = plVar1[-1];
      puVar11 = ix_arr + end + 1;
      puVar7 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                         (ix_arr + st,puVar11,Xc_ind + lVar9);
      if (missing_action == Fail) {
        local_68 = 0.0;
        local_70 = 0.0;
        local_b8 = 0.0;
        local_b0 = 0.0;
LAB_001c5fee:
        do {
          puVar2 = (ulong *)(Xc_ind + lVar9);
          while( true ) {
            if (((puVar7 == puVar11) || (lVar9 == lVar3)) || (uVar5 = *puVar7, uVar4 < uVar5))
            goto LAB_001c61b3;
            if (*puVar2 == uVar5) {
              pVar15 = tsl::detail_robin_hash::
                       robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                       ::try_emplace<unsigned_long_const&>
                                 ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                   *)w,puVar7);
              dVar13 = *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
              dVar14 = Xc[lVar9];
              dVar12 = dVar14 * dVar14;
              local_b0 = fma(dVar13,dVar14,local_b0);
              local_b8 = fma(dVar13,dVar12,local_b8);
              local_70 = fma(dVar13,dVar14 * dVar12,local_70);
              local_68 = fma(dVar13,dVar12 * dVar12,local_68);
              if ((puVar7 == ix_arr + end) || (lVar9 == lVar3 + -1)) goto LAB_001c61b3;
              puVar7 = puVar7 + 1;
              plVar8 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar2 + 1,plVar1,puVar7);
              lVar9 = (long)plVar8 - (long)Xc_ind >> 3;
              goto LAB_001c5fee;
            }
            if ((long)*puVar2 <= (long)uVar5) break;
            puVar7 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar7 + 1,puVar11,puVar2);
          }
          plVar8 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar2 + 1,plVar1,puVar7);
          lVar9 = (long)plVar8 - (long)Xc_ind >> 3;
        } while( true );
      }
      local_68 = 0.0;
      local_70 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
LAB_001c5e24:
      puVar2 = (ulong *)(Xc_ind + lVar9);
      do {
        if (((puVar7 == puVar11) || (lVar9 == lVar3)) || (uVar5 = *puVar7, uVar4 < uVar5)) {
LAB_001c618b:
          if (local_a8 <= 0.0) {
            return -INFINITY;
          }
LAB_001c61b3:
          if (local_a8 <= 1.0) {
            return -INFINITY;
          }
          if ((local_b8 == 0.0) && (!NAN(local_b8))) {
            return -INFINITY;
          }
          if ((local_b8 == local_b0 * local_b0) && (!NAN(local_b8) && !NAN(local_b0 * local_b0))) {
            return -INFINITY;
          }
          dVar12 = local_b0 / local_a8;
          dVar13 = dVar12 * dVar12;
          dVar14 = local_b8 / local_a8 - dVar13;
          if (NAN(dVar14)) {
            return -INFINITY;
          }
          if ((dVar14 <= 2.220446049250313e-16) &&
             (bVar6 = check_more_than_two_unique_values<double,long>
                                (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), !bVar6))
          {
            return -INFINITY;
          }
          if (dVar14 <= 0.0) {
            return 0.0;
          }
          dVar13 = (dVar13 * dVar12 * dVar12 * local_a8 +
                   local_b0 * -4.0 * dVar13 * dVar12 +
                   local_b8 * 6.0 * dVar13 + local_70 * -4.0 * dVar12 + local_68) /
                   (dVar14 * dVar14 * local_a8);
          if (0x7fefffffffffffff < (long)ABS(dVar13)) {
            return -INFINITY;
          }
          if (0.0 < dVar13) {
            return dVar13;
          }
          return 0.0;
        }
        if (*puVar2 == uVar5) {
          pVar15 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::try_emplace<unsigned_long_const&>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,puVar7);
          dVar13 = *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
          dVar14 = Xc[lVar9];
          if ((ulong)ABS(dVar14) < 0x7ff0000000000000) {
            dVar12 = dVar14 * dVar14;
            local_b0 = fma(dVar13,dVar14,local_b0);
            local_b8 = fma(dVar13,dVar12,local_b8);
            local_70 = fma(dVar13,dVar14 * dVar12,local_70);
            local_68 = fma(dVar13,dVar12 * dVar12,local_68);
          }
          else {
            local_a8 = local_a8 - dVar13;
          }
          if ((puVar7 == ix_arr + end) || (lVar9 == lVar3 + -1)) goto LAB_001c618b;
          puVar7 = puVar7 + 1;
          plVar8 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar2 + 1,plVar1,puVar7);
          lVar9 = (long)plVar8 - (long)Xc_ind >> 3;
          goto LAB_001c5e24;
        }
        if ((long)*puVar2 <= (long)uVar5) goto LAB_001c5e71;
        puVar7 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar7 + 1,puVar11,puVar2);
      } while( true );
    }
  }
  return -INFINITY;
LAB_001c5e71:
  plVar8 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (puVar2 + 1,plVar1,puVar7);
  lVar9 = (long)plVar8 - (long)Xc_ind >> 3;
  goto LAB_001c5e24;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}